

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::PoolingLayerParams::PoolingLayerParams
          (PoolingLayerParams *this,PoolingLayerParams *from)

{
  PoolingPaddingTypeCase PVar1;
  ValidPadding *this_00;
  ValidPadding *from_00;
  SamePadding *this_01;
  SamePadding *from_01;
  PoolingLayerParams_ValidCompletePadding *this_02;
  PoolingLayerParams_ValidCompletePadding *from_02;
  PoolingLayerParams *from_local;
  PoolingLayerParams *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__PoolingLayerParams_006f3fc8;
  google::protobuf::RepeatedField<unsigned_long>::RepeatedField
            (&this->kernelsize_,&from->kernelsize_);
  google::protobuf::RepeatedField<unsigned_long>::RepeatedField(&this->stride_,&from->stride_);
  PoolingPaddingTypeUnion::PoolingPaddingTypeUnion
            ((PoolingPaddingTypeUnion *)&this->PoolingPaddingType_);
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  memcpy(&this->type_,&from->type_,(long)this + (0x42 - (long)&this->type_));
  clear_has_PoolingPaddingType(this);
  PVar1 = PoolingPaddingType_case(from);
  switch(PVar1) {
  case POOLINGPADDINGTYPE_NOT_SET:
    break;
  case kValid:
    this_00 = _internal_mutable_valid(this);
    from_00 = _internal_valid(from);
    ValidPadding::MergeFrom(this_00,from_00);
    break;
  case kSame:
    this_01 = _internal_mutable_same(this);
    from_01 = _internal_same(from);
    SamePadding::MergeFrom(this_01,from_01);
    break;
  case kIncludeLastPixel:
    this_02 = _internal_mutable_includelastpixel(this);
    from_02 = _internal_includelastpixel(from);
    PoolingLayerParams_ValidCompletePadding::MergeFrom(this_02,from_02);
  }
  return;
}

Assistant:

PoolingLayerParams::PoolingLayerParams(const PoolingLayerParams& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      kernelsize_(from.kernelsize_),
      stride_(from.stride_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::memcpy(&type_, &from.type_,
    static_cast<size_t>(reinterpret_cast<char*>(&globalpooling_) -
    reinterpret_cast<char*>(&type_)) + sizeof(globalpooling_));
  clear_has_PoolingPaddingType();
  switch (from.PoolingPaddingType_case()) {
    case kValid: {
      _internal_mutable_valid()->::CoreML::Specification::ValidPadding::MergeFrom(from._internal_valid());
      break;
    }
    case kSame: {
      _internal_mutable_same()->::CoreML::Specification::SamePadding::MergeFrom(from._internal_same());
      break;
    }
    case kIncludeLastPixel: {
      _internal_mutable_includelastpixel()->::CoreML::Specification::PoolingLayerParams_ValidCompletePadding::MergeFrom(from._internal_includelastpixel());
      break;
    }
    case POOLINGPADDINGTYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.PoolingLayerParams)
}